

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMakefile.cxx
# Opt level: O0

void __thiscall cmMakefileCurrent::cmMakefileCurrent(cmMakefileCurrent *this,cmMakefile *mf)

{
  Snapshot snapshot;
  cmGlobalGenerator *pcVar1;
  cmMakefile *pcVar2;
  cmake *pcVar3;
  cmake *this_00;
  cmFileLockPool *this_01;
  Snapshot local_58;
  Snapshot local_40;
  PositionType local_28;
  cmMakefile *local_18;
  cmMakefile *mf_local;
  cmMakefileCurrent *this_local;
  
  local_18 = mf;
  mf_local = (cmMakefile *)this;
  cmLinkedTree<cmState::SnapshotDataType>::iterator::iterator(&local_28);
  cmState::Snapshot::Snapshot(&this->Snapshot,(cmState *)0x0,local_28);
  pcVar1 = cmMakefile::GetGlobalGenerator(local_18);
  this->GG = pcVar1;
  pcVar2 = cmGlobalGenerator::GetCurrentMakefile(this->GG);
  this->MF = pcVar2;
  pcVar3 = cmGlobalGenerator::GetCMakeInstance(this->GG);
  cmake::GetCurrentSnapshot(&local_40,pcVar3);
  (this->Snapshot).State = local_40.State;
  (this->Snapshot).Position.Tree = local_40.Position.Tree;
  (this->Snapshot).Position.Position = local_40.Position.Position;
  pcVar3 = cmGlobalGenerator::GetCMakeInstance(this->GG);
  this_00 = cmGlobalGenerator::GetCMakeInstance(this->GG);
  cmake::GetCurrentSnapshot(&local_58,this_00);
  snapshot.Position.Tree = local_58.Position.Tree;
  snapshot.State = local_58.State;
  snapshot.Position.Position = local_58.Position.Position;
  cmake::SetCurrentSnapshot(pcVar3,snapshot);
  cmGlobalGenerator::SetCurrentMakefile(this->GG,local_18);
  this_01 = cmGlobalGenerator::GetFileLockPool(this->GG);
  cmFileLockPool::PushFileScope(this_01);
  return;
}

Assistant:

cmMakefileCurrent(cmMakefile* mf)
    {
    this->GG = mf->GetGlobalGenerator();
    this->MF = this->GG->GetCurrentMakefile();
    this->Snapshot = this->GG->GetCMakeInstance()->GetCurrentSnapshot();
    this->GG->GetCMakeInstance()->SetCurrentSnapshot(
          this->GG->GetCMakeInstance()->GetCurrentSnapshot());
    this->GG->SetCurrentMakefile(mf);
#if defined(CMAKE_BUILD_WITH_CMAKE)
    this->GG->GetFileLockPool().PushFileScope();
#endif
    }